

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,string *read1_filename,string *read2_filename,
          string *output_filename,LinkedReadsFormat format,string *default_name,int readsize)

{
  string *in_RCX;
  string *in_RDX;
  WorkSpace *in_RSI;
  LinkedReadsDatastore *in_RDI;
  string *in_R8;
  LinkedReadsFormat in_R9D;
  string *in_stack_00000008;
  int in_stack_00000010;
  LinkedReadsDatastore *_datastore;
  LinkedReadsMapper *in_stack_ffffffffffffff40;
  string local_a0;
  string local_80;
  string local_60;
  LinkedReadsFormat local_2c;
  WorkSpace *local_10;
  
  _datastore = in_RDI;
  local_2c = in_R9D;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  LinkedReadsMapper::LinkedReadsMapper
            (in_stack_ffffffffffffff40,(WorkSpace *)&_datastore->mapper,_datastore);
  std::__cxx11::string::string((string *)&in_RDI->name);
  std::__cxx11::string::string((string *)&in_RDI->default_name);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3c3de6);
  in_RDI->fd = (FILE *)0x0;
  in_RDI->ws = local_10;
  std::__cxx11::string::string((string *)&local_60,in_R8);
  std::__cxx11::string::string((string *)&local_80,in_stack_00000008);
  std::__cxx11::string::string((string *)&local_a0,in_RDX);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff40,in_RCX);
  build_from_fastq(&local_60,&local_80,&local_a0,(string *)&stack0xffffffffffffff40,local_2c,
                   (long)in_stack_00000010,0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, std::string read1_filename, std::string read2_filename,
                                           std::string output_filename, LinkedReadsFormat format,
                                           std::string default_name, int readsize) : ws(ws), mapper(ws, *this) {
    build_from_fastq(output_filename, default_name, read1_filename, read2_filename, format, readsize, 0);
}